

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ArraySizeValidator::validateSingleVariable
          (ArraySizeValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  ostringstream *poVar1;
  pointer pVVar2;
  TestContext *this_00;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  undefined1 local_1a0 [16];
  TestLog local_190 [13];
  ios_base local_128 [264];
  
  pVVar2 = (path->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(path->
                super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2;
  if ((uVar3 < 0x11) || (*(int *)((long)pVVar2 + (uVar3 - 0x18)) != 0)) {
    bVar6 = false;
  }
  else {
    bVar6 = **(int **)((long)pVVar2 + (uVar3 - 0x20)) == 1;
  }
  if (bVar6) {
    bVar5 = *(int *)(*(long *)((long)pVVar2 + (uVar3 - 0x20)) + 0x10) == -1;
  }
  else {
    bVar5 = false;
  }
  iVar4 = 1;
  if (bVar6) {
    if (bVar5) {
      iVar4 = this->m_unsizedArraySize;
    }
    else {
      iVar4 = *(int *)(*(long *)((long)pVVar2 + (uVar3 - 0x20)) + 0x10);
    }
  }
  local_1a0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying array size, expecting ",0x20);
  std::ostream::operator<<(poVar1,iVar4);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_128);
  if (iVar4 != propValue) {
    local_1a0._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tError, got ",0xc);
    std::ostream::operator<<(poVar1,propValue);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_128);
    local_1a0._0_8_ = local_190;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"resource array size invalid","");
    this_00 = (this->super_SingleVariableValidator).super_PropValidator.m_testCtx;
    if (this_00->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,(char *)local_1a0._0_8_);
    }
    if ((TestLog *)local_1a0._0_8_ != local_190) {
      operator_delete((void *)local_1a0._0_8_,(ulong)((long)&(local_190[0].m_log)->flags + 1));
    }
  }
  return;
}

Assistant:

void ArraySizeValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const VariablePathComponent		nullComponent;
	const VariablePathComponent&	enclosingcomponent	= (path.size() > 1) ? (path[path.size()-2]) : (nullComponent);

	const bool						isArray				= enclosingcomponent.isVariableType() && enclosingcomponent.getVariableType()->isArrayType();
	const bool						inUnsizedArray		= isArray && (enclosingcomponent.getVariableType()->getArraySize() == glu::VarType::UNSIZED_ARRAY);
	const int						arraySize			= (!isArray) ? (1) : (inUnsizedArray) ? (m_unsizedArraySize) : (enclosingcomponent.getVariableType()->getArraySize());

	DE_ASSERT(arraySize >= 0);
	DE_UNREF(resource);
	DE_UNREF(implementationName);

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying array size, expecting " << arraySize << tcu::TestLog::EndMessage;

	if (arraySize != propValue)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
		setError("resource array size invalid");
	}
}